

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O3

void __thiscall
HighsHashTable<int,_std::pair<double,_int>_>::HighsHashTable
          (HighsHashTable<int,_std::pair<double,_int>_> *this,u64 minCapacity)

{
  pointer *__ptr;
  double dVar1;
  undefined1 auVar2 [16];
  
  auVar2._8_4_ = (int)(minCapacity >> 0x20);
  auVar2._0_8_ = minCapacity;
  auVar2._12_4_ = 0x45300000;
  this->numElements = 0;
  dVar1 = (((auVar2._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)minCapacity) - 4503599627370496.0)) * 8.0) / 7.0;
  if (dVar1 <= 128.0) {
    dVar1 = 128.0;
  }
  (this->entries)._M_t.
  super___uniq_ptr_impl<HighsHashTableEntry<int,_std::pair<double,_int>_>,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
  .super__Head_base<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_false>._M_head_impl =
       (HighsHashTableEntry<int,_std::pair<double,_int>_> *)0x0;
  (this->metadata)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  dVar1 = log2(dVar1);
  dVar1 = ceil(dVar1);
  makeEmptyTable(this,1L << (((byte)(long)dVar1 |
                             (byte)(long)(dVar1 - 9.223372036854776e+18) &
                             (byte)((long)dVar1 >> 0x3f)) & 0x3f));
  return;
}

Assistant:

HighsHashTable(u64 minCapacity) {
    u64 initCapacity = u64{1} << (u64)std::ceil(std::log2(std::max(
                           128.0, 8 * static_cast<double>(minCapacity) / 7)));
    makeEmptyTable(initCapacity);
  }